

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

ExecutionReport *
anon_unknown.dwarf_2926b4::createT1142ExecutionReport
          (ExecutionReport *__return_storage_ptr__,char *sender,char *target,int seq)

{
  int iVar1;
  Header *pHVar2;
  Trailer *this;
  FieldBase local_a40;
  FieldBase local_9e8;
  ContraTradeTime local_990;
  QTY local_938;
  ContraTradeQty local_930;
  allocator<char> local_8d1;
  STRING local_8d0;
  ContraTrader local_8b0;
  allocator<char> local_851;
  STRING local_850;
  ContraBroker local_830;
  ContraTradeTime local_7d8;
  QTY local_780;
  ContraTradeQty local_778;
  allocator<char> local_719;
  STRING local_718;
  ContraTrader local_6f8;
  allocator<char> local_699;
  STRING local_698;
  ContraBroker local_678;
  undefined1 local_620 [8];
  NoContraBrokers noContraBrokers;
  STRING local_5a0;
  BeginString local_580;
  FieldBase local_528;
  allocator<char> local_4c9;
  STRING local_4c8;
  BeginString local_4a8;
  PRICE local_450;
  AvgPx local_448;
  QTY local_3f0;
  CumQty local_3e8;
  QTY local_390;
  LeavesQty local_388;
  Side local_330;
  allocator<char> local_2d1;
  STRING local_2d0;
  Symbol local_2b0;
  CHAR local_251;
  OrdStatus local_250;
  CHAR local_1f1;
  ExecType local_1f0;
  CHAR local_191;
  ExecTransType local_190;
  allocator<char> local_131;
  STRING local_130;
  ExecID local_110;
  allocator<char> local_a1;
  STRING local_a0;
  OrderID local_80;
  byte local_25;
  int local_24;
  char *pcStack_20;
  int seq_local;
  char *target_local;
  char *sender_local;
  ExecutionReport *executionReport;
  
  local_25 = 0;
  local_24 = seq;
  pcStack_20 = target;
  target_local = sender;
  sender_local = (char *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"ID",&local_a1);
  FIX::OrderID::OrderID(&local_80,&local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"ID",&local_131);
  FIX::ExecID::ExecID(&local_110,&local_130);
  local_191 = '0';
  FIX::ExecTransType::ExecTransType(&local_190,&local_191);
  local_1f1 = '0';
  FIX::ExecType::ExecType(&local_1f0,&local_1f1);
  local_251 = '0';
  FIX::OrdStatus::OrdStatus(&local_250,&local_251);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"SYMBOL",&local_2d1);
  FIX::Symbol::Symbol(&local_2b0,&local_2d0);
  FIX::Side::Side(&local_330,"11ZN12_GLOBAL__N_123CATCH2_INTERNAL_TEST_434testEvE3$_2");
  local_390 = 100.0;
  FIX::LeavesQty::LeavesQty(&local_388,&local_390);
  local_3f0 = 0.0;
  FIX::CumQty::CumQty(&local_3e8,&local_3f0);
  local_450 = 0.0;
  FIX::AvgPx::AvgPx(&local_448,&local_450);
  FIX42::ExecutionReport::ExecutionReport
            (__return_storage_ptr__,&local_80,&local_110,&local_190,&local_1f0,&local_250,&local_2b0
             ,&local_330,&local_388,&local_3e8,&local_448);
  FIX::AvgPx::~AvgPx(&local_448);
  FIX::CumQty::~CumQty(&local_3e8);
  FIX::LeavesQty::~LeavesQty(&local_388);
  FIX::Side::~Side(&local_330);
  FIX::Symbol::~Symbol(&local_2b0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  FIX::OrdStatus::~OrdStatus(&local_250);
  FIX::ExecType::~ExecType(&local_1f0);
  FIX::ExecTransType::~ExecTransType(&local_190);
  FIX::ExecID::~ExecID(&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  FIX::OrderID::~OrderID(&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  pHVar2 = FIX42::Message::getHeader(&__return_storage_ptr__->super_Message);
  fillHeader((Header *)pHVar2,target_local,pcStack_20,local_24);
  pHVar2 = FIX42::Message::getHeader(&__return_storage_ptr__->super_Message);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c8,"FIXT.1.1",&local_4c9);
  FIX::BeginString::BeginString(&local_4a8,&local_4c8);
  FIX42::Header::set(pHVar2,&local_4a8);
  FIX::BeginString::~BeginString(&local_4a8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::~allocator(&local_4c9);
  pHVar2 = FIX42::Message::getHeader(&__return_storage_ptr__->super_Message);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5a0,"FIX.4.2",
             (allocator<char> *)((long)&noContraBrokers.super_Group.m_delim + 3));
  FIX::BeginString::BeginString(&local_580,&local_5a0);
  FIX::Message::toApplVerID((ApplVerID *)&local_528,&local_580);
  FIX::FieldMap::setField((FieldMap *)pHVar2,&local_528,true);
  FIX::ApplVerID::~ApplVerID((ApplVerID *)&local_528);
  FIX::BeginString::~BeginString(&local_580);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&noContraBrokers.super_Group.m_delim + 3));
  FIX42::ExecutionReport::NoContraBrokers::NoContraBrokers((NoContraBrokers *)local_620);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_698,"BROKER",&local_699);
  FIX::ContraBroker::ContraBroker(&local_678,&local_698);
  FIX42::ExecutionReport::NoContraBrokers::set((NoContraBrokers *)local_620,&local_678);
  FIX::ContraBroker::~ContraBroker(&local_678);
  std::__cxx11::string::~string((string *)&local_698);
  std::allocator<char>::~allocator(&local_699);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_718,"TRADER",&local_719);
  FIX::ContraTrader::ContraTrader(&local_6f8,&local_718);
  FIX42::ExecutionReport::NoContraBrokers::set((NoContraBrokers *)local_620,&local_6f8);
  FIX::ContraTrader::~ContraTrader(&local_6f8);
  std::__cxx11::string::~string((string *)&local_718);
  std::allocator<char>::~allocator(&local_719);
  local_780 = 100.0;
  FIX::ContraTradeQty::ContraTradeQty(&local_778,&local_780);
  FIX42::ExecutionReport::NoContraBrokers::set((NoContraBrokers *)local_620,&local_778);
  FIX::ContraTradeQty::~ContraTradeQty(&local_778);
  FIX::ContraTradeTime::now();
  FIX42::ExecutionReport::NoContraBrokers::set((NoContraBrokers *)local_620,&local_7d8);
  FIX::ContraTradeTime::~ContraTradeTime(&local_7d8);
  FIX::Message::addGroup((Message *)__return_storage_ptr__,(Group *)local_620);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_850,"BROKER2",&local_851);
  FIX::ContraBroker::ContraBroker(&local_830,&local_850);
  FIX42::ExecutionReport::NoContraBrokers::set((NoContraBrokers *)local_620,&local_830);
  FIX::ContraBroker::~ContraBroker(&local_830);
  std::__cxx11::string::~string((string *)&local_850);
  std::allocator<char>::~allocator(&local_851);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8d0,"TRADER2",&local_8d1);
  FIX::ContraTrader::ContraTrader(&local_8b0,&local_8d0);
  FIX42::ExecutionReport::NoContraBrokers::set((NoContraBrokers *)local_620,&local_8b0);
  FIX::ContraTrader::~ContraTrader(&local_8b0);
  std::__cxx11::string::~string((string *)&local_8d0);
  std::allocator<char>::~allocator(&local_8d1);
  local_938 = 100.0;
  FIX::ContraTradeQty::ContraTradeQty(&local_930,&local_938);
  FIX42::ExecutionReport::NoContraBrokers::set((NoContraBrokers *)local_620,&local_930);
  FIX::ContraTradeQty::~ContraTradeQty(&local_930);
  FIX::ContraTradeTime::now();
  FIX42::ExecutionReport::NoContraBrokers::set((NoContraBrokers *)local_620,&local_990);
  FIX::ContraTradeTime::~ContraTradeTime(&local_990);
  FIX::Message::addGroup((Message *)__return_storage_ptr__,(Group *)local_620);
  pHVar2 = FIX42::Message::getHeader(&__return_storage_ptr__->super_Message);
  iVar1 = FIX::Message::bodyLength((Message *)__return_storage_ptr__,8,9,10);
  FIX::BodyLength::BodyLength((BodyLength *)&local_9e8,iVar1);
  FIX::FieldMap::setField((FieldMap *)pHVar2,&local_9e8,true);
  FIX::BodyLength::~BodyLength((BodyLength *)&local_9e8);
  this = FIX42::Message::getTrailer(&__return_storage_ptr__->super_Message);
  iVar1 = FIX::Message::checkSum((Message *)__return_storage_ptr__,10);
  FIX::CheckSum::CheckSum((CheckSum *)&local_a40,iVar1);
  FIX::FieldMap::setField((FieldMap *)this,&local_a40,true);
  FIX::CheckSum::~CheckSum((CheckSum *)&local_a40);
  local_25 = 1;
  FIX42::ExecutionReport::NoContraBrokers::~NoContraBrokers((NoContraBrokers *)local_620);
  if ((local_25 & 1) == 0) {
    FIX42::ExecutionReport::~ExecutionReport(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

FIX42::ExecutionReport createT1142ExecutionReport(const char *sender, const char *target, int seq) {
  FIX42::ExecutionReport executionReport(
      OrderID("ID"),
      ExecID("ID"),
      ExecTransType('0'),
      ExecType('0'),
      OrdStatus('0'),
      Symbol("SYMBOL"),
      Side(Side_BUY),
      LeavesQty(100),
      CumQty(0),
      AvgPx(0));
  fillHeader(executionReport.getHeader(), sender, target, seq);
  executionReport.getHeader().set(BeginString("FIXT.1.1"));
  executionReport.getHeader().setField(ApplVerID(FIX::Message::toApplVerID(BeginString("FIX.4.2"))));
  FIX42::ExecutionReport::NoContraBrokers noContraBrokers;
  noContraBrokers.set(ContraBroker("BROKER"));
  noContraBrokers.set(ContraTrader("TRADER"));
  noContraBrokers.set(ContraTradeQty(100));
  noContraBrokers.set(ContraTradeTime::now());
  executionReport.addGroup(noContraBrokers);
  noContraBrokers.set(ContraBroker("BROKER2"));
  noContraBrokers.set(ContraTrader("TRADER2"));
  noContraBrokers.set(ContraTradeQty(100));
  noContraBrokers.set(ContraTradeTime::now());
  executionReport.addGroup(noContraBrokers);
  executionReport.getHeader().setField(BodyLength(executionReport.bodyLength()));
  executionReport.getTrailer().setField(CheckSum(executionReport.checkSum()));
  return executionReport;
}